

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Executor.h
# Opt level: O1

void __thiscall
nrg::Executor<nrg::AsyncExecutor<nrg::PrioExecution>_>::Executor
          (Executor<nrg::AsyncExecutor<nrg::PrioExecution>_> *this,ExceptionHandler *onError)

{
  _Manager_type p_Var1;
  undefined1 local_29;
  _Any_data local_28;
  _Manager_type local_18;
  _Invoker_type local_10;
  
  local_28._M_unused._M_object = (void *)0x0;
  local_28._8_8_ = 0;
  local_18 = (_Manager_type)0x0;
  local_10 = onError->_M_invoker;
  p_Var1 = (onError->super__Function_base)._M_manager;
  if (p_Var1 != (_Manager_type)0x0) {
    local_28._M_unused._0_8_ =
         (undefined8)*(undefined8 *)&(onError->super__Function_base)._M_functor;
    local_28._8_8_ = *(undefined8 *)((long)&(onError->super__Function_base)._M_functor + 8);
    (onError->super__Function_base)._M_manager = (_Manager_type)0x0;
    onError->_M_invoker = (_Invoker_type)0x0;
    local_18 = p_Var1;
  }
  (this->executor_).impl_.
  super___shared_ptr<nrg::detail::AsyncQueue<nrg::PrioExecution>,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (element_type *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<nrg::detail::AsyncQueue<nrg::PrioExecution>,std::allocator<nrg::detail::AsyncQueue<nrg::PrioExecution>>,std::function<void(std::exception_const&)>>
            (&(this->executor_).impl_.
              super___shared_ptr<nrg::detail::AsyncQueue<nrg::PrioExecution>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount,(AsyncQueue<nrg::PrioExecution> **)this,
             (allocator<nrg::detail::AsyncQueue<nrg::PrioExecution>_> *)&local_29,
             (function<void_(const_std::exception_&)> *)&local_28);
  if (local_18 != (_Manager_type)0x0) {
    (*local_18)(&local_28,&local_28,__destroy_functor);
  }
  return;
}

Assistant:

Executor(typename ExecutorPolicy::ExceptionHandler onError)
        : executor_(std::move(onError))
    {}